

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall StringBased_Sections_Test::TestBody(StringBased_Sections_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  reference pvVar4;
  reference pvVar5;
  AssertHelper local_350;
  Message local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_7;
  Message local_328;
  size_type local_320;
  unsigned_long local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_6;
  Message local_2f8;
  string local_2f0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_5;
  Message local_2b8;
  string local_2b0;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_4;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  Message local_258;
  size_type local_250;
  unsigned_long local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_2;
  Message local_228;
  string local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_1;
  Message local_1e8;
  size_type local_1e0;
  unsigned_long local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> output;
  stringstream local_198 [8];
  stringstream ofile;
  ostream local_188 [376];
  StringBased_Sections_Test *local_10;
  StringBased_Sections_Test *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,"one=three");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_188,"[second]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_188,"  two=four");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::istream::seekg((long)local_198,_S_beg);
  CLI::detail::parse_ini
            ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
             &gtest_ar.message_,(istream *)local_198);
  local_1d8 = 2;
  local_1e0 = CLI::std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::
              size((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                   &gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1d0,"(size_t)2","output.size()",&local_1d8,&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  pvVar4 = CLI::std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::at
                     ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                      &gtest_ar.message_,0);
  CLI::detail::ini_ret_t::name_abi_cxx11_(&local_220,pvVar4);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_200,"\"one\"","output.at(0).name()",(char (*) [4])0x18d2f6,
             &local_220);
  std::__cxx11::string::~string((string *)&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_248 = 1;
  pvVar4 = CLI::std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::at
                     ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                      &gtest_ar.message_,0);
  local_250 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&pvVar4->inputs);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_240,"(size_t)1","output.at(0).inputs.size()",&local_248,
             &local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  pvVar4 = CLI::std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::at
                     ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                      &gtest_ar.message_,0);
  pvVar5 = CLI::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&pvVar4->inputs,0);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_270,"\"three\"","output.at(0).inputs.at(0)",
             (char (*) [6])0x18d393,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x83,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  pvVar4 = CLI::std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::at
                     ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                      &gtest_ar.message_,1);
  CLI::detail::ini_ret_t::name_abi_cxx11_(&local_2b0,pvVar4);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_290,"\"two\"","output.at(1).name()",(char (*) [4])0x18d4b3,
             &local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  pvVar4 = CLI::std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::at
                     ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                      &gtest_ar.message_,1);
  CLI::detail::ini_ret_t::parent_abi_cxx11_(&local_2f0,pvVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_2d0,"\"second\"","output.at(1).parent()",
             (char (*) [7])"second",&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_318 = 1;
  pvVar4 = CLI::std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::at
                     ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                      &gtest_ar.message_,1);
  local_320 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&pvVar4->inputs);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_310,"(size_t)1","output.at(1).inputs.size()",&local_318,
             &local_320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x86,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  pvVar4 = CLI::std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::at
                     ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                      &gtest_ar.message_,1);
  pvVar5 = CLI::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&pvVar4->inputs,0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_340,"\"four\"","output.at(1).inputs.at(0)",
             (char (*) [5])0x18d39f,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  CLI::std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::~vector
            ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
             &gtest_ar.message_);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

TEST(StringBased, Sections) {
    std::stringstream ofile;

    ofile << "one=three" << std::endl;
    ofile << "[second]" << std::endl;
    ofile << "  two=four" << std::endl;

    ofile.seekg(0, std::ios::beg);

    auto output = CLI::detail::parse_ini(ofile);

    EXPECT_EQ((size_t)2, output.size());
    EXPECT_EQ("one", output.at(0).name());
    EXPECT_EQ((size_t)1, output.at(0).inputs.size());
    EXPECT_EQ("three", output.at(0).inputs.at(0));
    EXPECT_EQ("two", output.at(1).name());
    EXPECT_EQ("second", output.at(1).parent());
    EXPECT_EQ((size_t)1, output.at(1).inputs.size());
    EXPECT_EQ("four", output.at(1).inputs.at(0));
}